

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::Initialize(cmCTest *this,char *binary_dir,cmCTestStartCommand *command)

{
  string *path;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  cmMakefile *this_00;
  tm *ptVar4;
  bool suppress;
  int iVar5;
  cmGlobalGenerator *this_01;
  char cVar6;
  undefined8 in_stack_fffffffffffff0b8;
  undefined4 uVar7;
  string tag;
  string testingDir;
  time_t tctime;
  auto_ptr<cmMakefile> mf;
  int day;
  undefined4 uStack_ee4;
  int min;
  int hour;
  string tagfile;
  int year;
  undefined4 uStack_e9c;
  string tagmode;
  byte abStack_d08 [480];
  int mon;
  cmake cm;
  ifstream tfin;
  byte abStack_7e8 [496];
  cmGlobalGenerator gg;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffff0b8 >> 0x20);
  if (command == (cmCTestStartCommand *)0x0) {
    suppress = false;
  }
  else {
    suppress = command->Quiet;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
  poVar3 = std::operator<<((ostream *)&gg,"Here: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x181);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x181,(char *)cm.Generators.
                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,suppress);
  std::__cxx11::string::~string((string *)&cm);
  this_01 = &gg;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  if (this->InteractiveDebugMode == false) {
    BlockTestErrorDiagnostics((cmCTest *)this_01);
  }
  else {
    std::__cxx11::string::string((string *)&gg,"CTEST_INTERACTIVE_DEBUG_MODE=1",(allocator *)&cm);
    cmsys::SystemTools::PutEnv((string *)&gg);
    std::__cxx11::string::~string((string *)&gg);
  }
  path = &this->BinaryDir;
  std::__cxx11::string::assign((char *)path);
  cmsys::SystemTools::ConvertToUnixSlashes(path);
  UpdateCTestConfiguration(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
  poVar3 = std::operator<<((ostream *)&gg,"Here: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x18d);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x18d,(char *)cm.Generators.
                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,suppress);
  std::__cxx11::string::~string((string *)&cm);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
  if (this->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
    poVar3 = std::operator<<((ostream *)&gg,"Here: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,399);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        399,(char *)cm.Generators.
                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,suppress);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
    poVar3 = std::operator<<((ostream *)&gg,"   Site: ");
    std::__cxx11::string::string((string *)&tfin,"Site",(allocator *)&testingDir);
    GetCTestConfiguration((string *)&cm,this,(string *)&tfin);
    poVar3 = std::operator<<(poVar3,(string *)&cm);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"   Build name: ");
    std::__cxx11::string::string((string *)&mon,"BuildName",(allocator *)&tagfile);
    GetCTestConfiguration((string *)&year,this,(string *)&mon);
    SafeBuildIdField(&tagmode,(string *)&year);
    poVar3 = std::operator<<(poVar3,(string *)&tagmode);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&tagmode);
    std::__cxx11::string::~string((string *)&year);
    std::__cxx11::string::~string((string *)&mon);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::string::~string((string *)&tfin);
    std::__cxx11::stringbuf::str();
    Log(this,1,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x196,(char *)cm.Generators.
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,suppress);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
    poVar3 = std::operator<<((ostream *)&gg,"Produce XML is on");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x197,(char *)cm.Generators.
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,suppress);
    std::__cxx11::string::~string((string *)&cm);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
    if (this->TestModel == 1) {
      std::__cxx11::string::string((string *)&cm,"NightlyStartTime",(allocator *)&tfin);
      GetCTestConfiguration((string *)&gg,this,(string *)&cm);
      std::__cxx11::string::~string((string *)&gg);
      std::__cxx11::string::~string((string *)&cm);
      if (gg._8_8_ == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
        poVar3 = std::operator<<((ostream *)&gg,
                                 "WARNING: No nightly start time found please set in CTestConfig.cmake or DartConfig.cmake"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x19f,(char *)cm.Generators.
                           super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,suppress);
        std::__cxx11::string::~string((string *)&cm);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&gg);
        poVar3 = std::operator<<((ostream *)&gg,"Here: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1a0);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        Log(this,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x1a1,(char *)cm.Generators.
                           super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,suppress);
        std::__cxx11::string::~string((string *)&cm);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gg);
        return 0;
      }
    }
  }
  iVar5 = 1;
  cmake::cmake(&cm,RoleScript);
  std::__cxx11::string::string((string *)&gg,"",(allocator *)&tfin);
  cmake::SetHomeDirectory(&cm,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  std::__cxx11::string::string((string *)&gg,"",(allocator *)&tfin);
  cmake::SetHomeOutputDirectory(&cm,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  gg.MakeSilentFlag._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.Position.Position;
  gg._vptr_cmGlobalGenerator = (_func_int **)cm.CurrentSnapshot.State;
  gg._8_8_ = cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  this_00 = (cmMakefile *)operator_new(0x760);
  _tfin = (pointer)cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(this_00,&gg,(cmStateSnapshot *)&tfin);
  mf.x_ = this_00;
  ReadCustomConfigurationFileTree(this,(this->BinaryDir)._M_dataplus._M_p,this_00);
  if (this->ProduceXML != true) goto LAB_002db0ad;
  std::operator+(&testingDir,path,"/Testing");
  bVar1 = cmsys::SystemTools::FileExists(testingDir._M_dataplus._M_p);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileIsDirectory(&testingDir);
    if (bVar1) {
LAB_002da803:
      if (command == (cmCTestStartCommand *)0x0) {
        cVar6 = '\x01';
      }
      else {
        cVar6 = command->CreateNewTag;
      }
      std::operator+(&tagfile,&testingDir,"/TAG");
      std::ifstream::ifstream(&tfin,tagfile._M_dataplus._M_p,_S_in);
      tag._M_dataplus._M_p = (pointer)&tag.field_2;
      tag._M_string_length = 0;
      tag.field_2._M_local_buf[0] = '\0';
      if (cVar6 == '\0') {
        if ((abStack_7e8
             [((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(_tfin + -0x18))->_M_allocated_capacity] & 5) == 0) {
          cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&tag,(bool *)0x0,-1);
          std::ifstream::close();
          if (tag._M_string_length != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&tagmode);
            poVar3 = std::operator<<((ostream *)&tagmode,"  Use existing tag: ");
            poVar3 = std::operator<<(poVar3,(string *)&tag);
            poVar3 = std::operator<<(poVar3," - ");
            GetTestModelString_abi_cxx11_((string *)&year,this);
            poVar3 = std::operator<<(poVar3,(string *)&year);
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__cxx11::string::~string((string *)&year);
            std::__cxx11::stringbuf::str();
            Log(this,1,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x219,(char *)CONCAT44(uStack_e9c,year),suppress);
            std::__cxx11::string::~string((string *)&year);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tagmode);
            goto LAB_002db06b;
          }
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&tagmode);
        poVar3 = std::operator<<((ostream *)&tagmode,"Cannot read existing TAG file in ");
        poVar3 = std::operator<<(poVar3,(string *)&testingDir);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::stringbuf::str();
        iVar5 = 0;
        Log(this,6,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x212,(char *)CONCAT44(uStack_e9c,year),false);
        std::__cxx11::string::~string((string *)&year);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tagmode);
      }
      else {
        tctime = time((time_t *)0x0);
        if (this->TomorrowTag == true) {
          tctime = tctime + 0x15180;
        }
        ptVar4 = gmtime(&tctime);
        if (((abStack_7e8
              [((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(_tfin + -0x18))->_M_allocated_capacity] & 5) == 0) &&
           (bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&tag,(bool *)0x0,-1),
           bVar1)) {
          year = 0;
          mon = 0;
          day = 0;
          hour = 0;
          uVar7 = (undefined4)((ulong)&min >> 0x20);
          min = 0;
          __isoc99_sscanf(tag._M_dataplus._M_p,"%04d%02d%02d-%02d%02d",&year);
          if ((year != ptVar4->tm_year + 0x76c) ||
             ((mon != ptVar4->tm_mon + 1 || (day != ptVar4->tm_mday)))) {
            std::__cxx11::string::assign((char *)&tag);
          }
          tagmode._M_dataplus._M_p = (pointer)&tagmode.field_2;
          tagmode._M_string_length = 0;
          tagmode.field_2._M_local_buf[0] = '\0';
          bVar1 = cmsys::SystemTools::GetLineFromStream((istream *)&tfin,&tagmode,(bool *)0x0,-1);
          if ((bVar1 && 4 < tagmode._M_string_length) && (this->Parts[0].Enabled == false)) {
            iVar2 = GetTestModelFromString(tagmode._M_dataplus._M_p);
            this->TestModel = iVar2;
          }
          std::ifstream::close();
          std::__cxx11::string::~string((string *)&tagmode);
        }
        if (((command != (cmCTestStartCommand *)0x0) || (tag._M_string_length == 0)) ||
           (this->Parts[0].Enabled == true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&tagmode);
          poVar3 = std::operator<<((ostream *)&tagmode,"TestModel: ");
          GetTestModelString_abi_cxx11_((string *)&year,this);
          poVar3 = std::operator<<(poVar3,(string *)&year);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&year);
          std::__cxx11::stringbuf::str();
          Log(this,0,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x1f0,(char *)CONCAT44(uStack_e9c,year),suppress);
          std::__cxx11::string::~string((string *)&year);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tagmode);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&tagmode);
          poVar3 = std::operator<<((ostream *)&tagmode,"TestModel: ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TestModel);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::stringbuf::str();
          Log(this,0,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x1f2,(char *)CONCAT44(uStack_e9c,year),suppress);
          std::__cxx11::string::~string((string *)&year);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tagmode);
          if (this->TestModel == 1) {
            std::__cxx11::string::string((string *)&year,"NightlyStartTime",(allocator *)&mon);
            GetCTestConfiguration(&tagmode,this,(string *)&year);
            ptVar4 = (tm *)GetNightlyTime(this,&tagmode,this->TomorrowTag);
            std::__cxx11::string::~string((string *)&tagmode);
            std::__cxx11::string::~string((string *)&year);
          }
          sprintf((char *)&mon,"%04d%02d%02d-%02d%02d",(ulong)(ptVar4->tm_year + 0x76c),
                  (ulong)(ptVar4->tm_mon + 1),(ulong)(uint)ptVar4->tm_mday,
                  (ulong)(uint)ptVar4->tm_hour,CONCAT44(uVar7,ptVar4->tm_min));
          std::__cxx11::string::assign((char *)&tag);
          std::ofstream::ofstream(&tagmode,tagfile._M_dataplus._M_p,_S_out);
          if ((abStack_d08[*(long *)(tagmode._M_dataplus._M_p + -0x18)] & 5) == 0) {
            poVar3 = std::operator<<((ostream *)&tagmode,(string *)&tag);
            std::endl<char,std::char_traits<char>>(poVar3);
            GetTestModelString_abi_cxx11_((string *)&year,this);
            poVar3 = std::operator<<((ostream *)&tagmode,(string *)&year);
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__cxx11::string::~string((string *)&year);
          }
          std::ofstream::close();
          if (command == (cmCTestStartCommand *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&year);
            poVar3 = std::operator<<((ostream *)&year,"Create new tag: ");
            poVar3 = std::operator<<(poVar3,(string *)&tag);
            poVar3 = std::operator<<(poVar3," - ");
            GetTestModelString_abi_cxx11_((string *)&day,this);
            poVar3 = std::operator<<(poVar3,(string *)&day);
            std::endl<char,std::char_traits<char>>(poVar3);
            std::__cxx11::string::~string((string *)&day);
            std::__cxx11::stringbuf::str();
            Log(this,1,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x207,(char *)CONCAT44(uStack_ee4,day),suppress);
            std::__cxx11::string::~string((string *)&day);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&year);
          }
          std::ofstream::~ofstream(&tagmode);
        }
LAB_002db06b:
        std::__cxx11::string::_M_assign((string *)&this->CurrentTag);
      }
      std::__cxx11::string::~string((string *)&tag);
      std::ifstream::~ifstream(&tfin);
      std::__cxx11::string::~string((string *)&tagfile);
      std::__cxx11::string::~string((string *)&testingDir);
      goto LAB_002db0ad;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tfin);
    poVar3 = std::operator<<((ostream *)&tfin,"File ");
    poVar3 = std::operator<<(poVar3,(string *)&testingDir);
    poVar3 = std::operator<<(poVar3," is in the place of the testing directory");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x1bd,tagmode._M_dataplus._M_p,false);
  }
  else {
    bVar1 = cmsys::SystemTools::MakeDirectory(testingDir._M_dataplus._M_p);
    if (bVar1) goto LAB_002da803;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tfin);
    poVar3 = std::operator<<((ostream *)&tfin,"Cannot create directory ");
    poVar3 = std::operator<<(poVar3,(string *)&testingDir);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x1c3,tagmode._M_dataplus._M_p,false);
  }
  std::__cxx11::string::~string((string *)&tagmode);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tfin);
  std::__cxx11::string::~string((string *)&testingDir);
  iVar5 = 0;
LAB_002db0ad:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  return iVar5;
}

Assistant:

int cmCTest::Initialize(const char* binary_dir, cmCTestStartCommand* command)
{
  bool quiet = false;
  if (command && command->ShouldBeQuiet()) {
    quiet = true;
  }

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (!this->InteractiveDebugMode) {
    this->BlockTestErrorDiagnostics();
  } else {
    cmSystemTools::PutEnv("CTEST_INTERACTIVE_DEBUG_MODE=1");
  }

  this->BinaryDir = binary_dir;
  cmSystemTools::ConvertToUnixSlashes(this->BinaryDir);

  this->UpdateCTestConfiguration();

  cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
  if (this->ProduceXML) {
    cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl, quiet);
    cmCTestOptionalLog(
      this, OUTPUT, "   Site: "
        << this->GetCTestConfiguration("Site") << std::endl
        << "   Build name: "
        << cmCTest::SafeBuildIdField(this->GetCTestConfiguration("BuildName"))
        << std::endl,
      quiet);
    cmCTestOptionalLog(this, DEBUG, "Produce XML is on" << std::endl, quiet);
    if (this->TestModel == cmCTest::NIGHTLY &&
        this->GetCTestConfiguration("NightlyStartTime").empty()) {
      cmCTestOptionalLog(
        this, WARNING,
        "WARNING: No nightly start time found please set in CTestConfig.cmake"
        " or DartConfig.cmake"
          << std::endl,
        quiet);
      cmCTestOptionalLog(this, DEBUG, "Here: " << __LINE__ << std::endl,
                         quiet);
      return 0;
    }
  }

  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  if (!this->ReadCustomConfigurationFileTree(this->BinaryDir.c_str(),
                                             mf.get())) {
    cmCTestOptionalLog(
      this, DEBUG, "Cannot find custom configuration file tree" << std::endl,
      quiet);
    return 0;
  }

  if (this->ProduceXML) {
    // Verify "Testing" directory exists:
    //
    std::string testingDir = this->BinaryDir + "/Testing";
    if (cmSystemTools::FileExists(testingDir.c_str())) {
      if (!cmSystemTools::FileIsDirectory(testingDir)) {
        cmCTestLog(this, ERROR_MESSAGE, "File "
                     << testingDir
                     << " is in the place of the testing directory"
                     << std::endl);
        return 0;
      }
    } else {
      if (!cmSystemTools::MakeDirectory(testingDir.c_str())) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot create directory "
                     << testingDir << std::endl);
        return 0;
      }
    }

    // Create new "TAG" file or read existing one:
    //
    bool createNewTag = true;
    if (command) {
      createNewTag = command->ShouldCreateNewTag();
    }

    std::string tagfile = testingDir + "/TAG";
    cmsys::ifstream tfin(tagfile.c_str());
    std::string tag;

    if (createNewTag) {
      time_t tctime = time(CM_NULLPTR);
      if (this->TomorrowTag) {
        tctime += (24 * 60 * 60);
      }
      struct tm* lctime = gmtime(&tctime);
      if (tfin && cmSystemTools::GetLineFromStream(tfin, tag)) {
        int year = 0;
        int mon = 0;
        int day = 0;
        int hour = 0;
        int min = 0;
        sscanf(tag.c_str(), "%04d%02d%02d-%02d%02d", &year, &mon, &day, &hour,
               &min);
        if (year != lctime->tm_year + 1900 || mon != lctime->tm_mon + 1 ||
            day != lctime->tm_mday) {
          tag = "";
        }
        std::string tagmode;
        if (cmSystemTools::GetLineFromStream(tfin, tagmode)) {
          if (tagmode.size() > 4 && !this->Parts[PartStart]) {
            this->TestModel = cmCTest::GetTestModelFromString(tagmode.c_str());
          }
        }
        tfin.close();
      }
      if (tag.empty() || (CM_NULLPTR != command) || this->Parts[PartStart]) {
        cmCTestOptionalLog(
          this, DEBUG,
          "TestModel: " << this->GetTestModelString() << std::endl, quiet);
        cmCTestOptionalLog(
          this, DEBUG, "TestModel: " << this->TestModel << std::endl, quiet);
        if (this->TestModel == cmCTest::NIGHTLY) {
          lctime = this->GetNightlyTime(
            this->GetCTestConfiguration("NightlyStartTime"),
            this->TomorrowTag);
        }
        char datestring[100];
        sprintf(datestring, "%04d%02d%02d-%02d%02d", lctime->tm_year + 1900,
                lctime->tm_mon + 1, lctime->tm_mday, lctime->tm_hour,
                lctime->tm_min);
        tag = datestring;
        cmsys::ofstream ofs(tagfile.c_str());
        if (ofs) {
          ofs << tag << std::endl;
          ofs << this->GetTestModelString() << std::endl;
        }
        ofs.close();
        if (CM_NULLPTR == command) {
          cmCTestOptionalLog(this, OUTPUT, "Create new tag: "
                               << tag << " - " << this->GetTestModelString()
                               << std::endl,
                             quiet);
        }
      }
    } else {
      if (tfin) {
        cmSystemTools::GetLineFromStream(tfin, tag);
        tfin.close();
      }

      if (tag.empty()) {
        cmCTestLog(this, ERROR_MESSAGE, "Cannot read existing TAG file in "
                     << testingDir << std::endl);
        return 0;
      }

      cmCTestOptionalLog(this, OUTPUT, "  Use existing tag: "
                           << tag << " - " << this->GetTestModelString()
                           << std::endl,
                         quiet);
    }

    this->CurrentTag = tag;
  }

  return 1;
}